

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O2

void __thiscall UEFITool::openImageFileInNewWindow(UEFITool *this)

{
  QArrayDataPointer<QString> local_60;
  QArrayDataPointer<char16_t> local_48;
  QString path;
  
  tr((QString *)&local_60,"Open BIOS image file in new window",(char *)0x0,-1);
  tr((QString *)&local_48,
     "BIOS image files (*.rom *.bin *.cap *scap *.bio *.fd *.wph *.dec);;All files (*)",(char *)0x0,
     -1);
  QFileDialog::getOpenFileName(&path,this,&local_60,&this->currentDir,&local_48,0,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
  QString::trimmed_helper((QString *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
  if (local_60.size != 0) {
    QList<QString>::QList<QString,void>((QList<QString> *)&local_60,&path);
    local_48.d = (Data *)0x0;
    local_48.ptr = (char16_t *)0x0;
    local_48.size = 0;
    QProcess::startDetached
              ((QString *)&this->currentProgramPath,(QList *)&local_60,(QString *)&local_48,
               (longlong *)0x0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_60);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&path.d);
  return;
}

Assistant:

void UEFITool::openImageFileInNewWindow()
{
    QString path = QFileDialog::getOpenFileName(this, tr("Open BIOS image file in new window"), currentDir, tr("BIOS image files (*.rom *.bin *.cap *scap *.bio *.fd *.wph *.dec);;All files (*)"));
    if (path.trimmed().isEmpty())
        return;
    QProcess::startDetached(currentProgramPath, QStringList(path));
}